

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-socket.c
# Opt level: O0

void cf_socket_adjust_pollset(Curl_cfilter *cf,Curl_easy *data,easy_pollset *ps)

{
  void *pvVar1;
  cf_socket_ctx *ctx;
  easy_pollset *ps_local;
  Curl_easy *data_local;
  Curl_cfilter *cf_local;
  
  pvVar1 = cf->ctx;
  if (*(int *)((long)pvVar1 + 0x98) != -1) {
    if ((cf->field_0x24 & 1) == 0) {
      Curl_pollset_change(data,ps,*(curl_socket_t *)((long)pvVar1 + 0x98),2,1);
      if (((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x8ba >> 0x1c & 1) != 0)) &&
         ((cf != (Curl_cfilter *)0x0 && (0 < cf->cft->log_level)))) {
        Curl_trc_cf_infof(data,cf,"adjust_pollset(!connected) -> %d socks",(ulong)ps->num);
      }
    }
    else if (((((*(byte *)((long)pvVar1 + 0x17c) >> 3 & 1) == 0) &&
              (Curl_pollset_change(data,ps,*(curl_socket_t *)((long)pvVar1 + 0x98),1,0),
              data != (Curl_easy *)0x0)) && ((*(ulong *)&(data->set).field_0x8ba >> 0x1c & 1) != 0))
            && ((cf != (Curl_cfilter *)0x0 && (0 < cf->cft->log_level)))) {
      Curl_trc_cf_infof(data,cf,"adjust_pollset(!active) -> %d socks",(ulong)ps->num);
    }
  }
  return;
}

Assistant:

static void cf_socket_adjust_pollset(struct Curl_cfilter *cf,
                                      struct Curl_easy *data,
                                      struct easy_pollset *ps)
{
  struct cf_socket_ctx *ctx = cf->ctx;

  if(ctx->sock != CURL_SOCKET_BAD) {
    if(!cf->connected) {
      Curl_pollset_set_out_only(data, ps, ctx->sock);
      CURL_TRC_CF(data, cf, "adjust_pollset(!connected) -> %d socks", ps->num);
    }
    else if(!ctx->active) {
      Curl_pollset_add_in(data, ps, ctx->sock);
      CURL_TRC_CF(data, cf, "adjust_pollset(!active) -> %d socks", ps->num);
    }
  }
}